

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O3

void av1_cyclic_reset_segment_skip
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,RUN_TYPE dry_run)

{
  _Bool _Var1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MB_MODE_INFO *pMVar6;
  CYCLIC_REFRESH *pCVar7;
  uint8_t *puVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  undefined7 in_register_00000081;
  uint uVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  size_t __n;
  int iVar16;
  
  pMVar6 = *(x->e_mbd).mi;
  uVar2 = *(ushort *)&pMVar6->field_0xa7;
  uVar10 = uVar2 & 7;
  pCVar7 = cpi->cyclic_refresh;
  uVar9 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  iVar3 = (cpi->common).mi_params.mi_cols;
  uVar12 = iVar3 - mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar9]
      <= (int)uVar12) {
    uVar12 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar9];
  }
  iVar16 = (cpi->common).mi_params.mi_rows;
  uVar11 = iVar16 - mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar9]
      <= (int)uVar11) {
    uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [uVar9];
  }
  if (pCVar7->skip_over4x4 != 0) goto LAB_003bbea3;
  iVar4 = (x->e_mbd).mi_row;
  iVar5 = (x->e_mbd).mi_col;
  puVar8 = ((cpi->common).cur_frame)->seg_map;
  _Var1 = (x->e_mbd).left_available;
  if ((x->e_mbd).up_available == false) {
    if ((_Var1 & 1U) != 0) {
      bVar13 = 0xff;
      bVar14 = 0xff;
      goto LAB_003bbdbf;
    }
    bVar15 = 0;
  }
  else {
    bVar13 = 0xff;
    if (((_Var1 & 1U) != 0) && (bVar13 = 8, iVar5 <= iVar3 && iVar4 <= iVar16)) {
      bVar13 = 8;
      if (puVar8[(iVar4 + -1) * iVar3 + iVar5 + -1] < 8) {
        bVar13 = puVar8[(iVar4 + -1) * iVar3 + iVar5 + -1];
      }
    }
    if (iVar5 < iVar3 && iVar4 <= iVar16) {
      bVar14 = 8;
      if (puVar8[(iVar4 + -1) * iVar3 + iVar5] < 8) {
        bVar14 = puVar8[(iVar4 + -1) * iVar3 + iVar5];
      }
    }
    else {
      bVar14 = 8;
    }
    bVar15 = bVar14;
    if ((_Var1 & 1U) != 0) {
LAB_003bbdbf:
      bVar15 = 0;
      if (iVar5 <= iVar3 && iVar4 < iVar16) {
        bVar15 = 0;
        if (puVar8[iVar3 * iVar4 + iVar5 + -1] < 8) {
          bVar15 = puVar8[iVar3 * iVar4 + iVar5 + -1];
        }
      }
      if ((bVar14 != 0xff) && (bVar13 == bVar14)) {
        bVar15 = bVar14;
      }
    }
  }
  bVar15 = bVar15 & 7;
  *(ushort *)&pMVar6->field_0xa7 = uVar2 & 0xfff8 | (ushort)bVar15;
  if ((uVar10 != bVar15) && (0 < (int)uVar11)) {
    iVar3 = (cpi->common).mi_params.mi_cols;
    __n = (size_t)(int)uVar12;
    uVar9 = (ulong)uVar11;
    iVar16 = mi_col + mi_row * iVar3;
    do {
      memset(pCVar7->map + iVar16,0,__n);
      memset((cpi->enc_seg).map + iVar16,(uint)bVar15,__n);
      memset(((cpi->common).cur_frame)->seg_map + iVar16,(uint)bVar15,__n);
      iVar16 = iVar16 + iVar3;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
LAB_003bbea3:
  if (dry_run == '\0') {
    if (uVar10 == 2) {
      x->actual_num_seg2_blocks = x->actual_num_seg2_blocks - uVar11 * uVar12;
    }
    else if (uVar10 == 1) {
      x->actual_num_seg1_blocks = x->actual_num_seg1_blocks - uVar11 * uVar12;
    }
  }
  return;
}

Assistant:

void av1_cyclic_reset_segment_skip(const AV1_COMP *cpi, MACROBLOCK *const x,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   RUN_TYPE dry_run) {
  int cdf_num;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int prev_segment_id = mbmi->segment_id;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, bw);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, bh);

  assert(cm->seg.enabled);

  if (!cr->skip_over4x4) {
    mbmi->segment_id =
        av1_get_spatial_seg_pred(cm, xd, &cdf_num, cr->skip_over4x4);
    if (prev_segment_id != mbmi->segment_id) {
      const int block_index = mi_row * cm->mi_params.mi_cols + mi_col;
      const int mi_stride = cm->mi_params.mi_cols;
      const uint8_t segment_id = mbmi->segment_id;
      for (int mi_y = 0; mi_y < ymis; mi_y++) {
        const int map_offset = block_index + mi_y * mi_stride;
        memset(&cr->map[map_offset], 0, xmis);
        memset(&cpi->enc_seg.map[map_offset], segment_id, xmis);
        memset(&cm->cur_frame->seg_map[map_offset], segment_id, xmis);
      }
    }
  }
  if (!dry_run) {
    if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST1)
      x->actual_num_seg1_blocks -= xmis * ymis;
    else if (cyclic_refresh_segment_id(prev_segment_id) == CR_SEGMENT_ID_BOOST2)
      x->actual_num_seg2_blocks -= xmis * ymis;
  }
}